

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  int iVar1;
  uint32 uVar2;
  long lVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  Int64Parameter *pIVar7;
  long *plVar8;
  Int64Set *pIVar9;
  Int64Parameter *pIVar10;
  int iVar11;
  NearestNeighborsIndex *pNVar12;
  long lVar13;
  NearestNeighborsIndex aIndex;
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex local_d0;
  NearestNeighborsIndex local_80;
  
  pNVar12 = a->nearestneighborsindex_;
  if (pNVar12 == (NearestNeighborsIndex *)0x0) {
    pNVar12 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_d0,pNVar12);
  pNVar12 = b->nearestneighborsindex_;
  if (pNVar12 == (NearestNeighborsIndex *)0x0) {
    pNVar12 = (NearestNeighborsIndex *)&_NearestNeighborsIndex_default_instance_;
  }
  NearestNeighborsIndex::NearestNeighborsIndex(&local_80,pNVar12);
  if ((local_d0.numberofdimensions_ == local_80.numberofdimensions_) &&
     (local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_ ==
      local_80.floatsamples_.super_RepeatedPtrFieldBase.current_size_)) {
    if (0 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_) {
      iVar11 = 0;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar11);
        iVar1 = (pTVar5->vector_).current_size_;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar11);
        if (iVar1 != (pTVar5->vector_).current_size_) goto LAB_002e6cec;
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_d0.floatsamples_.super_RepeatedPtrFieldBase,iVar11);
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                           (&local_80.floatsamples_.super_RepeatedPtrFieldBase,iVar11);
        bVar4 = operator==(&pTVar5->vector_,&pTVar6->vector_);
        if (!bVar4) goto LAB_002e6cec;
        iVar11 = iVar11 + 1;
      } while (iVar11 < local_d0.floatsamples_.super_RepeatedPtrFieldBase.current_size_);
    }
    if ((local_d0._oneof_case_[0] == local_80._oneof_case_[0]) &&
       (local_d0._oneof_case_[1] == local_80._oneof_case_[1])) {
      pIVar7 = a->numberofneighbors_;
      if (pIVar7 == (Int64Parameter *)0x0) {
        pIVar7 = (Int64Parameter *)&_Int64Parameter_default_instance_;
      }
      pIVar10 = b->numberofneighbors_;
      if (pIVar10 == (Int64Parameter *)0x0) {
        pIVar10 = (Int64Parameter *)&_Int64Parameter_default_instance_;
      }
      if ((pIVar7->defaultvalue_ == pIVar10->defaultvalue_) &&
         (uVar2 = pIVar7->_oneof_case_[0], uVar2 == pIVar10->_oneof_case_[0])) {
        if (uVar2 == 0xb) {
          iVar11 = (((pIVar7->AllowedValues_).set_)->values_).current_size_;
          if (iVar11 != (((pIVar10->AllowedValues_).set_)->values_).current_size_)
          goto LAB_002e6cec;
          if (0 < iVar11) {
            lVar13 = 0;
            do {
              pIVar7 = a->numberofneighbors_;
              if (pIVar7 == (Int64Parameter *)0x0) {
                pIVar7 = (Int64Parameter *)&_Int64Parameter_default_instance_;
              }
              if (pIVar7->_oneof_case_[0] == 0xb) {
                pIVar9 = (pIVar7->AllowedValues_).set_;
              }
              else {
                pIVar9 = Int64Set::default_instance();
              }
              plVar8 = google::protobuf::RepeatedField<long>::Get(&pIVar9->values_,(int)lVar13);
              pIVar7 = b->numberofneighbors_;
              if (pIVar7 == (Int64Parameter *)0x0) {
                pIVar7 = (Int64Parameter *)&_Int64Parameter_default_instance_;
              }
              lVar3 = *plVar8;
              if (pIVar7->_oneof_case_[0] == 0xb) {
                pIVar9 = (pIVar7->AllowedValues_).set_;
              }
              else {
                pIVar9 = Int64Set::default_instance();
              }
              plVar8 = google::protobuf::RepeatedField<long>::Get(&pIVar9->values_,(int)lVar13);
              if (lVar3 != *plVar8) goto LAB_002e6cec;
              lVar13 = lVar13 + 1;
            } while (iVar11 != lVar13);
          }
        }
        else if (uVar2 == 10) {
          if ((((pIVar7->AllowedValues_).range_)->minvalue_ !=
               ((pIVar10->AllowedValues_).range_)->minvalue_) ||
             (((pIVar7->AllowedValues_).range_)->maxvalue_ !=
              ((pIVar10->AllowedValues_).range_)->maxvalue_)) goto LAB_002e6cec;
        }
        uVar2 = a->_oneof_case_[0];
        if (uVar2 == b->_oneof_case_[0]) {
          if (uVar2 == 0) {
            bVar4 = true;
            goto LAB_002e6cee;
          }
          if (uVar2 == 100) {
            bVar4 = vectorsEqual<CoreML::Specification::StringVector>
                              ((a->ClassLabels_).stringclasslabels_,
                               (b->ClassLabels_).stringclasslabels_);
            goto LAB_002e6cee;
          }
          if (uVar2 == 0x65) {
            bVar4 = vectorsEqual<CoreML::Specification::Int64Vector>
                              ((a->ClassLabels_).int64classlabels_,
                               (b->ClassLabels_).int64classlabels_);
            goto LAB_002e6cee;
          }
        }
      }
    }
  }
LAB_002e6cec:
  bVar4 = false;
LAB_002e6cee:
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_80);
  NearestNeighborsIndex::~NearestNeighborsIndex(&local_d0);
  return bVar4;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }